

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editline.c
# Opt level: O0

el_status_t c_complete(void)

{
  el_status_t eVar1;
  char *pcVar2;
  el_status_t local_40;
  int local_3c;
  el_status_t s;
  int unique;
  size_t len;
  char *string;
  char *word;
  char *q;
  char *p;
  
  local_40 = CSdone;
  if (rl_inhibit_complete != 0) {
    return CSdispatch;
  }
  string = el_find_word();
  q = rl_complete(string,&local_3c);
  if (string != (char *)0x0) {
    free(string);
  }
  if (q != (char *)0x0) {
    _s = strlen(q);
    string = q;
    len = (size_t)malloc(_s * 2 + 1);
    word = (char *)len;
    if ((char *)len == (char *)0x0) {
      free(string);
      return CSstay;
    }
    while (*q != '\0') {
      if (((*q < ' ') ||
          (pcVar2 = strchr("\"#$&\'()*:;<=>?[\\]^`{|}~\n\t ",(int)*q), pcVar2 != (char *)0x0)) &&
         ((local_3c == 0 || (q[1] != '\0')))) {
        *word = '\\';
        word = word + 1;
      }
      *word = *q;
      word = word + 1;
      q = q + 1;
    }
    *word = '\0';
    free(string);
    if (_s != 0) {
      local_40 = insert_string((char *)len);
    }
    free((void *)len);
    if (_s != 0) {
      return local_40;
    }
  }
  eVar1 = c_possible();
  return eVar1;
}

Assistant:

static el_status_t c_complete(void)
{
    char        *p, *q;
    char        *word, *string;
    size_t      len;
    int         unique;
    el_status_t s = CSdone;

    if (rl_inhibit_complete)
        return CSdispatch;

    word = el_find_word();
    p = rl_complete(word, &unique);
    if (word)
        free(word);
    if (p) {
        len = strlen(p);
        word = p;

        string = q = malloc(sizeof(char) * (2 * len + 1));
        if (!string) {
            free(word);
            return CSstay;
        }

        while (*p) {
            if ((*p < ' ' || strchr(SEPS, *p) != NULL)
                && (!unique || p[1] != 0)) {
                *q++ = '\\';
            }
            *q++ = *p++;
        }
        *q = '\0';
        free(word);

        if (len > 0) {
            s = insert_string(string);
#ifdef CONFIG_TERMINAL_BELL
            if (!unique)
                el_ring_bell();
#endif
        }
        free(string);

        if (len > 0)
            return s;
    }

    return c_possible();
}